

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O1

void __thiscall Shell::NewCNF::Occurrences::replaceBy(Occurrences *this,Formula *f)

{
  bool *pbVar1;
  uint uVar2;
  GenClause *x;
  RefCounter *pRVar3;
  pair<Kernel::Formula_*,_bool> *ppVar4;
  bool bVar5;
  bool bVar6;
  void **head_2;
  Literal *pLVar7;
  void **head;
  void **head_1;
  Iterator occit;
  Iterator local_50;
  
  local_50._iterator._prev = (List<Shell::NewCNF::Occurrence> *)0x0;
  local_50._iterator._cur = (List<Shell::NewCNF::Occurrence> *)0x0;
  local_50._current._obj = (Occurrence *)0x0;
  local_50._current._refCnt = (RefCounter *)0x0;
  local_50._iterator._lst = &this->_occurrences;
  if ((f->_connective == LITERAL) &&
     (pLVar7 = *(Literal **)(f + 1), ((pLVar7->super_Term)._args[0]._content & 0xc) == 8)) {
    f = (Formula *)
        ::Lib::FixedSizeAllocator<48UL>::alloc
                  ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pLVar7 = Kernel::Literal::complementaryLiteral(pLVar7);
    f->_connective = LITERAL;
    (f->_label)._M_dataplus._M_p = (pointer)&(f->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(f + 1) = pLVar7;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  while( true ) {
    bVar6 = Iterator::hasNext(&local_50);
    if (!bVar6) break;
    x = ((local_50._current._obj)->gc)._obj;
    pRVar3 = ((local_50._current._obj)->gc)._refCnt;
    if (pRVar3 != (RefCounter *)0x0 && x != (GenClause *)0x0) {
      pRVar3->_val = pRVar3->_val + 1;
    }
    uVar2 = (local_50._current._obj)->position;
    ppVar4 = (x->_literals)._array;
    ppVar4[uVar2].first = f;
    if (bVar5) {
      pbVar1 = &ppVar4[uVar2].second;
      *pbVar1 = (bool)(*pbVar1 ^ 1);
    }
    if ((x != (GenClause *)0x0 && pRVar3 != (RefCounter *)0x0) &&
       (pRVar3->_val = pRVar3->_val + -1, pRVar3->_val == 0)) {
      checked_delete<Shell::NewCNF::GenClause>(x);
      *(undefined8 *)pRVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar3;
    }
  }
  if (((local_50._current._obj != (Occurrence *)0x0) &&
      (local_50._current._refCnt != (RefCounter *)0x0)) &&
     ((local_50._current._refCnt)->_val = (local_50._current._refCnt)->_val + -1,
     (local_50._current._refCnt)->_val == 0)) {
    checked_delete<Shell::NewCNF::Occurrence>(local_50._current._obj);
    if (local_50._current._refCnt != (RefCounter *)0x0) {
      *(undefined8 *)local_50._current._refCnt = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._current._refCnt;
    }
  }
  return;
}

Assistant:

void replaceBy(Formula* f) {
      Occurrences::Iterator occit(*this);

      bool negateOccurrenceSign = false;
      if (f->connective() == LITERAL) {
        Literal* l = f->literal();
        if (l->shared() && ((SIGN)l->polarity() != POSITIVE)) {
          f = new AtomicFormula(Literal::complementaryLiteral(l));
          negateOccurrenceSign = true;
        }
      }

      while (occit.hasNext()) {
        Occurrence occ = occit.next();
        GenLit& gl = occ.gc->_literals[occ.position];
        formula(gl) = f;
        if (negateOccurrenceSign) {
          sign(gl) = OPPOSITE(sign(gl));
        }
      }
    }